

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# req.c
# Opt level: O1

void req0_ctx_init(void *arg,void *sock)

{
  nni_mtx_lock((nni_mtx *)((long)sock + 0x358));
  *(void **)arg = sock;
  *(undefined8 *)((long)arg + 0x50) = 0;
  *(undefined4 *)((long)arg + 0x78) = *sock;
  nni_list_append((nni_list *)((long)sock + 0xe8),arg);
  nni_mtx_unlock((nni_mtx *)((long)sock + 0x358));
  return;
}

Assistant:

static void
req0_ctx_init(void *arg, void *sock)
{
	req0_sock *s   = sock;
	req0_ctx  *ctx = arg;

	nni_mtx_lock(&s->mtx);
	ctx->sock     = s;
	ctx->recv_aio = NULL;
	ctx->retry    = s->retry;
	nni_list_append(&s->contexts, ctx);
	nni_mtx_unlock(&s->mtx);
}